

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O0

void SampleRandomPolicy(DecPOMDPDiscreteInterface *dpomdp,Arguments *args)

{
  NullPlanner *this;
  ulong uVar1;
  ulong uVar2;
  AgentRandom *this_00;
  ostream *poVar3;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *this_01;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *pvVar4;
  reference ppAVar5;
  Arguments *in_RSI;
  DecPOMDPDiscreteInterface *in_RDI;
  double dVar6;
  uint i_1;
  AgentRandom agent;
  AgentFullyObservable *agent1;
  uint i;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  NullPlanner *np;
  SimulationResult *in_stack_fffffffffffffe68;
  value_type in_stack_fffffffffffffe70;
  value_type *in_stack_fffffffffffffe78;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *in_stack_fffffffffffffe80
  ;
  uint local_12c;
  SimulationResult local_128 [48];
  AgentRandom local_f8 [40];
  AgentRandom *local_d0;
  uint local_c4;
  SimulationResult local_a8 [48];
  SimulationDecPOMDPDiscrete local_78 [64];
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *in_stack_ffffffffffffffc8
  ;
  SimulationDecPOMDPDiscrete *in_stack_ffffffffffffffd0;
  
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)in_RSI->horizon,in_RDI,(PlanningUnitMADPDiscreteParameters *)0x0);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (local_78,(PlanningUnitDecPOMDPDiscrete *)this,in_RSI);
  Simulation::SetVerbose((Simulation *)local_78,false);
  SimulationResult::SimulationResult(local_a8);
  std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::vector
            ((vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)0x135354);
  local_c4 = 0;
  while( true ) {
    uVar1 = (ulong)local_c4;
    uVar2 = (**(code **)(*(long *)this + 0x30))();
    if (uVar1 == uVar2) break;
    AgentRandom::AgentRandom(local_f8,(PlanningUnitDecPOMDPDiscrete *)this,0);
    this_00 = (AgentRandom *)operator_new(0x28);
    AgentRandom::AgentRandom(this_00,local_f8);
    local_d0 = this_00;
    (**(code **)(*(long *)(this_00 + *(long *)(*(long *)this_00 + -0x18)) + 0x18))
              (this_00 + *(long *)(*(long *)this_00 + -0x18),local_c4);
    std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::push_back
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    AgentRandom::~AgentRandom(local_f8);
    local_c4 = local_c4 + 1;
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SimulationResult::operator=
            ((SimulationResult *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  SimulationResult::~SimulationResult(local_128);
  if (-1 < in_RSI->verbose) {
    poVar3 = std::operator<<((ostream *)&std::cout,"evaluateRandomPolicy sampled value: ");
    dVar6 = SimulationResult::GetAvgReward(local_a8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_12c = 0;
  while( true ) {
    this_01 = (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)
              (ulong)local_12c;
    pvVar4 = (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)
             (**(code **)(*(long *)this + 0x30))();
    if (this_01 == pvVar4) break;
    ppAVar5 = std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::at
                        ((vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)
                         in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe70 = *ppAVar5;
    if (in_stack_fffffffffffffe70 != (value_type)0x0) {
      (**(code **)(*(long *)in_stack_fffffffffffffe70 + 8))();
    }
    local_12c = local_12c + 1;
  }
  if (this != (NullPlanner *)0x0) {
    (**(code **)(*(long *)this + 8))();
  }
  std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::~vector(this_01);
  SimulationResult::~SimulationResult(local_a8);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_78);
  return;
}

Assistant:

void SampleRandomPolicy(DecPOMDPDiscreteInterface* dpomdp,
                        const ArgumentHandlers::Arguments &args)
{
    NullPlanner* np=new NullPlanner(args.horizon,dpomdp);

    SimulationDecPOMDPDiscrete sim(*np,args);
    sim.SetVerbose(false);
    SimulationResult result;

    vector<AgentFullyObservable*> agents;
    for(unsigned int i=0;i!=np->GetNrAgents();++i)
    {
        AgentFullyObservable *agent1;
        AgentRandom agent(np,0);
        agent1=new AgentRandom(agent);
        agent1->SetIndex(i);
        agents.push_back(agent1);
    }
    result=sim.RunSimulations(agents);

    if(args.verbose >= 0)
        cout << "evaluateRandomPolicy sampled value: "
             << result.GetAvgReward() << endl;

    for(unsigned int i=0;i!=np->GetNrAgents();++i)
        delete agents.at(i);
    delete np;
}